

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfOutputFile * ImfOpenOutputFile(char *name,ImfHeader *hdr,int channels)

{
  ImfOutputFile *pIVar1;
  ImfHeader *in_RSI;
  int in_stack_00000008;
  RgbaChannels in_stack_0000000c;
  Header *in_stack_00000010;
  char *in_stack_00000018;
  exception *e;
  
  pIVar1 = (ImfOutputFile *)operator_new(0x18);
  anon_unknown.dwarf_70604::header(in_RSI);
  Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)e,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
             in_stack_00000008);
  return pIVar1;
}

Assistant:

ImfOutputFile*
ImfOpenOutputFile (const char name[], const ImfHeader* hdr, int channels)
{
    try
    {
        return (ImfOutputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            RgbaOutputFile (
                name,
                *header (hdr),
                OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}